

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O2

bool __thiscall
GenericFunctionInstanceTypeRequest::operator==
          (GenericFunctionInstanceTypeRequest *this,GenericFunctionInstanceTypeRequest *rhs)

{
  TypeHandle *pTVar1;
  TypeHandle *pTVar2;
  MatchData *pMVar3;
  MatchData *pMVar4;
  IntrusiveList<TypeHandle> *pIVar5;
  IntrusiveList<TypeHandle> *pIVar6;
  IntrusiveList<MatchData> *pIVar7;
  IntrusiveList<MatchData> *pIVar8;
  
  if ((this->parentType == rhs->parentType) && (this->function == rhs->function)) {
    pIVar5 = &this->arguments;
    pIVar6 = &rhs->arguments;
    while( true ) {
      pTVar1 = pIVar6->head;
      pTVar2 = pIVar5->head;
      if (pTVar2 == (TypeHandle *)0x0 && pTVar1 == (TypeHandle *)0x0) {
        pIVar8 = &this->aliases;
        pIVar7 = &rhs->aliases;
        while( true ) {
          pMVar3 = pIVar7->head;
          pMVar4 = pIVar8->head;
          if ((((pMVar4 == (MatchData *)0x0) || (pMVar3 == (MatchData *)0x0)) ||
              (pMVar4->name != pMVar3->name)) || (pMVar4->type != pMVar3->type)) break;
          pIVar8 = (IntrusiveList<MatchData> *)&pMVar4->next;
          pIVar7 = (IntrusiveList<MatchData> *)&pMVar3->next;
        }
        return pMVar4 == (MatchData *)0x0 && pMVar3 == (MatchData *)0x0;
      }
      if (((pTVar2 == (TypeHandle *)0x0) || (pTVar1 == (TypeHandle *)0x0)) ||
         (pTVar2->type != pTVar1->type)) break;
      pIVar5 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
      pIVar6 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
    }
  }
  return false;
}

Assistant:

bool operator==(const GenericFunctionInstanceTypeRequest& rhs) const
	{
		if(parentType != rhs.parentType)
			return false;

		if(function != rhs.function)
			return false;

		for(TypeHandle *leftArg = arguments.head, *rightArg = rhs.arguments.head; leftArg || rightArg; leftArg = leftArg->next, rightArg = rightArg->next)
		{
			if(!leftArg || !rightArg)
				return false;

			if(leftArg->type != rightArg->type)
				return false;
		}

		for(MatchData *leftAlias = aliases.head, *rightAlias = rhs.aliases.head; leftAlias || rightAlias; leftAlias = leftAlias->next, rightAlias = rightAlias->next)
		{
			if(!leftAlias || !rightAlias)
				return false;

			if(leftAlias->name != rightAlias->name || leftAlias->type != rightAlias->type)
				return false;
		}

		return true;
	}